

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_index_info * allocateIndexInfo(WhereBestIdx *p)

{
  int iVar1;
  Parse *pParse_00;
  WhereClause *pWVar2;
  SrcList_item *pSVar3;
  ExprList *pEVar4;
  Expr *pEVar5;
  WhereLevel **ppWVar6;
  Bitmask BVar7;
  Expr *pExpr_1;
  u8 op;
  Expr *pExpr;
  int n;
  sqlite3_index_info *pIdxInfo;
  WhereTerm *pWStack_68;
  int nOrderBy;
  WhereTerm *pTerm;
  sqlite3_index_constraint_usage *pUsage;
  sqlite3_index_orderby *pIdxOrderBy;
  sqlite3_index_constraint *pIdxCons;
  int local_40;
  int nTerm;
  int j;
  int i;
  ExprList *pOrderBy;
  SrcList_item *pSrc;
  WhereClause *pWC;
  Parse *pParse;
  WhereBestIdx *p_local;
  
  pParse_00 = p->pParse;
  pWVar2 = p->pWC;
  pSVar3 = p->pSrc;
  pEVar4 = p->pOrderBy;
  pIdxCons._4_4_ = 0;
  nTerm = 0;
  pWStack_68 = pWVar2->a;
  for (; nTerm < pWVar2->nTerm; nTerm = nTerm + 1) {
    if ((pWStack_68->leftCursor == pSVar3->iCursor) && ((pWStack_68->eOperator & 0x80) == 0)) {
      pIdxCons._4_4_ = pIdxCons._4_4_ + 1;
    }
    pWStack_68 = pWStack_68 + 1;
  }
  pIdxInfo._4_4_ = 0;
  if (pEVar4 != (ExprList *)0x0) {
    iVar1 = pEVar4->nExpr;
    nTerm = 0;
    while (((nTerm < iVar1 && (pEVar5 = pEVar4->a[nTerm].pExpr, pEVar5->op == 0x98)) &&
           (pEVar5->iTable == pSVar3->iCursor))) {
      nTerm = nTerm + 1;
    }
    if (nTerm == iVar1) {
      pIdxInfo._4_4_ = iVar1;
    }
  }
  p_local = (WhereBestIdx *)
            sqlite3DbMallocZero(pParse_00->db,pIdxCons._4_4_ * 0x14 + 0x48 + pIdxInfo._4_4_ * 8);
  if (p_local == (WhereBestIdx *)0x0) {
    sqlite3ErrorMsg(pParse_00,"out of memory");
    p_local = (WhereBestIdx *)0x0;
  }
  else {
    ppWVar6 = &p_local->aLevel;
    BVar7 = (long)ppWVar6 + (long)pIdxCons._4_4_ * 0xc;
    *(int *)&p_local->pParse = pIdxCons._4_4_;
    *(int *)&p_local->pSrc = pIdxInfo._4_4_;
    p_local->pWC = (WhereClause *)ppWVar6;
    p_local->notReady = BVar7;
    p_local->notValid = BVar7 + (long)pIdxInfo._4_4_ * 8;
    local_40 = 0;
    nTerm = 0;
    pWStack_68 = pWVar2->a;
    for (; nTerm < pWVar2->nTerm; nTerm = nTerm + 1) {
      if ((pWStack_68->leftCursor == pSVar3->iCursor) && ((pWStack_68->eOperator & 0x80) == 0)) {
        *(int *)((long)ppWVar6 + (long)local_40 * 0xc) = (pWStack_68->u).leftColumn;
        *(int *)((long)ppWVar6 + (long)local_40 * 0xc + 8) = nTerm;
        pExpr_1._7_1_ = (char)pWStack_68->eOperator;
        if (pExpr_1._7_1_ == '\x01') {
          pExpr_1._7_1_ = '\x02';
        }
        *(char *)((long)ppWVar6 + (long)local_40 * 0xc + 4) = pExpr_1._7_1_;
        local_40 = local_40 + 1;
      }
      pWStack_68 = pWStack_68 + 1;
    }
    for (nTerm = 0; nTerm < pIdxInfo._4_4_; nTerm = nTerm + 1) {
      *(int *)(BVar7 + (long)nTerm * 8) = (int)(pEVar4->a[nTerm].pExpr)->iColumn;
      *(u8 *)(BVar7 + ((long)nTerm * 2 + 1) * 4) = pEVar4->a[nTerm].sortOrder;
    }
  }
  return (sqlite3_index_info *)p_local;
}

Assistant:

static sqlite3_index_info *allocateIndexInfo(WhereBestIdx *p){
  Parse *pParse = p->pParse; 
  WhereClause *pWC = p->pWC;
  struct SrcList_item *pSrc = p->pSrc;
  ExprList *pOrderBy = p->pOrderBy;
  int i, j;
  int nTerm;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_orderby *pIdxOrderBy;
  struct sqlite3_index_constraint_usage *pUsage;
  WhereTerm *pTerm;
  int nOrderBy;
  sqlite3_index_info *pIdxInfo;

  WHERETRACE(("Recomputing index info for %s...\n", pSrc->pTab->zName));

  /* Count the number of possible WHERE clause constraints referring
  ** to this virtual table */
  for(i=nTerm=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    if( pTerm->leftCursor != pSrc->iCursor ) continue;
    assert( IsPowerOfTwo(pTerm->eOperator & ~WO_EQUIV) );
    testcase( pTerm->eOperator & WO_IN );
    testcase( pTerm->eOperator & WO_ISNULL );
    if( pTerm->eOperator & (WO_ISNULL) ) continue;
    if( pTerm->wtFlags & TERM_VNULL ) continue;
    nTerm++;
  }

  /* If the ORDER BY clause contains only columns in the current 
  ** virtual table then allocate space for the aOrderBy part of
  ** the sqlite3_index_info structure.
  */
  nOrderBy = 0;
  if( pOrderBy ){
    int n = pOrderBy->nExpr;
    for(i=0; i<n; i++){
      Expr *pExpr = pOrderBy->a[i].pExpr;
      if( pExpr->op!=TK_COLUMN || pExpr->iTable!=pSrc->iCursor ) break;
    }
    if( i==n){
      nOrderBy = n;
    }
  }

  /* Allocate the sqlite3_index_info structure
  */
  pIdxInfo = sqlite3DbMallocZero(pParse->db, sizeof(*pIdxInfo)
                           + (sizeof(*pIdxCons) + sizeof(*pUsage))*nTerm
                           + sizeof(*pIdxOrderBy)*nOrderBy );
  if( pIdxInfo==0 ){
    sqlite3ErrorMsg(pParse, "out of memory");
    /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
    return 0;
  }

  /* Initialize the structure.  The sqlite3_index_info structure contains
  ** many fields that are declared "const" to prevent xBestIndex from
  ** changing them.  We have to do some funky casting in order to
  ** initialize those fields.
  */
  pIdxCons = (struct sqlite3_index_constraint*)&pIdxInfo[1];
  pIdxOrderBy = (struct sqlite3_index_orderby*)&pIdxCons[nTerm];
  pUsage = (struct sqlite3_index_constraint_usage*)&pIdxOrderBy[nOrderBy];
  *(int*)&pIdxInfo->nConstraint = nTerm;
  *(int*)&pIdxInfo->nOrderBy = nOrderBy;
  *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint = pIdxCons;
  *(struct sqlite3_index_orderby**)&pIdxInfo->aOrderBy = pIdxOrderBy;
  *(struct sqlite3_index_constraint_usage**)&pIdxInfo->aConstraintUsage =
                                                                   pUsage;

  for(i=j=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    u8 op;
    if( pTerm->leftCursor != pSrc->iCursor ) continue;
    assert( IsPowerOfTwo(pTerm->eOperator & ~WO_EQUIV) );
    testcase( pTerm->eOperator & WO_IN );
    testcase( pTerm->eOperator & WO_ISNULL );
    if( pTerm->eOperator & (WO_ISNULL) ) continue;
    if( pTerm->wtFlags & TERM_VNULL ) continue;
    pIdxCons[j].iColumn = pTerm->u.leftColumn;
    pIdxCons[j].iTermOffset = i;
    op = (u8)pTerm->eOperator & WO_ALL;
    if( op==WO_IN ) op = WO_EQ;
    pIdxCons[j].op = op;
    /* The direct assignment in the previous line is possible only because
    ** the WO_ and SQLITE_INDEX_CONSTRAINT_ codes are identical.  The
    ** following asserts verify this fact. */
    assert( WO_EQ==SQLITE_INDEX_CONSTRAINT_EQ );
    assert( WO_LT==SQLITE_INDEX_CONSTRAINT_LT );
    assert( WO_LE==SQLITE_INDEX_CONSTRAINT_LE );
    assert( WO_GT==SQLITE_INDEX_CONSTRAINT_GT );
    assert( WO_GE==SQLITE_INDEX_CONSTRAINT_GE );
    assert( WO_MATCH==SQLITE_INDEX_CONSTRAINT_MATCH );
    assert( pTerm->eOperator & (WO_IN|WO_EQ|WO_LT|WO_LE|WO_GT|WO_GE|WO_MATCH) );
    j++;
  }
  for(i=0; i<nOrderBy; i++){
    Expr *pExpr = pOrderBy->a[i].pExpr;
    pIdxOrderBy[i].iColumn = pExpr->iColumn;
    pIdxOrderBy[i].desc = pOrderBy->a[i].sortOrder;
  }

  return pIdxInfo;
}